

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

string * __thiscall
google::LogSink::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LogSink *this,LogSeverity severity,char *file,int line,
          LogMessageTime *logmsgtime,char *message,size_t message_len)

{
  int *piVar1;
  long *this_00;
  ostream *poVar2;
  _func_int **pp_Var3;
  pthread_t pVar4;
  size_t sVar5;
  undefined4 in_register_00000014;
  char *__s;
  undefined4 in_register_00000084;
  _func_int *p_Var6;
  ostringstream stream;
  undefined1 auStack_1b8 [7];
  char local_1b1;
  LogMessageTime *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  __s = (char *)CONCAT44(in_register_00000014,severity);
  piVar1 = (int *)CONCAT44(in_register_00000084,line);
  local_1b0 = logmsgtime;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var6 = *(_func_int **)(local_1a8._0_8_ + -0x18);
  if ((acStack_c8 + 1)[(long)p_Var6] == '\0') {
    std::ios::widen((char)(auStack_1b8 + (long)p_Var6) + '\x10');
    (acStack_c8 + 1)[(long)p_Var6] = '\x01';
  }
  acStack_c8[(long)p_Var6] = '0';
  local_1b1 = **(char **)(LogSeverityNames + ((ulong)this & 0xffffffff) * 8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b1,1);
  if (fLB::FLAGS_log_year_in_prefix == '\x01') {
    *(undefined8 *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x10)) = 4;
    std::ostream::operator<<(local_1a8,piVar1[5] + 0x76c);
  }
  *(undefined8 *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x10)) = 2;
  this_00 = (long *)std::ostream::operator<<(local_1a8,piVar1[4] + 1);
  *(undefined8 *)((long)this_00 + *(long *)(*this_00 + -0x18) + 0x10) = 2;
  poVar2 = (ostream *)std::ostream::operator<<(this_00,piVar1[3]);
  local_1b1 = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b1,1);
  *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 2;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,piVar1[2]);
  local_1b1 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b1,1);
  *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 2;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,piVar1[1]);
  local_1b1 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b1,1);
  *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 2;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar1);
  local_1b1 = '.';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b1,1);
  *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 6;
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  local_1b1 = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b1,1);
  pp_Var3 = poVar2->_vptr_basic_ostream;
  p_Var6 = (_func_int *)((long)&poVar2->_vptr_basic_ostream + (long)pp_Var3[-3]);
  if ((&poVar2->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
    std::ios::widen((char)p_Var6);
    p_Var6[0xe1] = (code)0x1;
    pp_Var3 = poVar2->_vptr_basic_ostream;
  }
  p_Var6[0xe0] = (code)0x20;
  *(undefined8 *)(&poVar2->field_0x10 + (long)pp_Var3[-3]) = 5;
  pVar4 = pthread_self();
  if (pVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"thread::id of a non-executing thread",0x24);
  }
  else {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  p_Var6 = (_func_int *)((long)&poVar2->_vptr_basic_ostream + (long)poVar2->_vptr_basic_ostream[-3])
  ;
  if ((&poVar2->field_0xe1)[(long)poVar2->_vptr_basic_ostream[-3]] == '\0') {
    std::ios::widen((char)p_Var6);
    p_Var6[0xe1] = (code)0x1;
  }
  p_Var6[0xe0] = (code)0x30;
  local_1b1 = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b1,1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
  }
  else {
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar5);
  }
  local_1b1 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b1,1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)file);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
  std::ostream::write(local_1a8,(long)local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string LogSink::ToString(LogSeverity severity, const char* file, int line,
                         const LogMessageTime& logmsgtime, const char* message,
                         size_t message_len) {
  ostringstream stream;
  stream.fill('0');

  stream << LogSeverityNames[severity][0];
  if (FLAGS_log_year_in_prefix) {
    stream << setw(4) << 1900 + logmsgtime.year();
  }
  stream << setw(2) << 1 + logmsgtime.month() << setw(2) << logmsgtime.day()
         << ' ' << setw(2) << logmsgtime.hour() << ':' << setw(2)
         << logmsgtime.min() << ':' << setw(2) << logmsgtime.sec() << '.'
         << setw(6) << logmsgtime.usec() << ' ' << setfill(' ') << setw(5)
         << std::this_thread::get_id() << setfill('0') << ' ' << file << ':'
         << line << "] ";

  // A call to `write' is enclosed in parenthneses to prevent possible macro
  // expansion.  On Windows, `write' could be a macro defined for portability.
  (stream.write)(message, static_cast<std::streamsize>(message_len));
  return stream.str();
}